

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O1

void __thiscall
QHexView::setBackgroundSize(QHexView *this,qint64 begin,qint64 length,QColor *bgcolor)

{
  undefined8 uVar1;
  QHexMetadataItem local_58;
  
  local_58.end = length + begin;
  local_58.foreground.cspec = Invalid;
  local_58.foreground.ct.argb.alpha = 0xffff;
  local_58.foreground.ct._2_8_ = 0;
  uVar1 = *(undefined8 *)((long)&bgcolor->ct + 2);
  local_58.background._0_6_ = SUB86(*(undefined8 *)bgcolor,0);
  local_58.background.ct.argb.red = (ushort)uVar1;
  local_58.background.ct._4_6_ = (undefined6)((ulong)uVar1 >> 0x10);
  local_58.comment.d.d = (Data *)0x0;
  local_58.comment.d.ptr = (char16_t *)0x0;
  local_58.comment.d.size = 0;
  local_58.begin = begin;
  QHexMetadata::setMetadata(this->m_hexmetadata,&local_58);
  if (&(local_58.comment.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_58.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_58.comment.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

void QHexView::setBackgroundSize(qint64 begin, qint64 length,
                                 const QColor& bgcolor) {
    m_hexmetadata->setBackgroundSize(begin, length, bgcolor);
}